

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void * vrna_alloc(uint size)

{
  void *pvVar1;
  int *piVar2;
  void *extraout_RAX;
  char *format;
  
  pvVar1 = calloc(1,(ulong)size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0xc) {
    format = "Memory allocation failure -> no memory";
  }
  else {
    if (*piVar2 != 0x16) {
      return (void *)0x0;
    }
    fprintf(_stderr,"vrna_alloc: requested size: %d\n",size);
    format = "Memory allocation failure -> EINVAL";
  }
  vrna_message_error(format);
  return extraout_RAX;
}

Assistant:

PUBLIC void *
vrna_alloc(unsigned size)
{
  void *pointer;

  if ((pointer = (void *)calloc(1, (size_t)size)) == NULL) {
#ifdef EINVAL
    if (errno == EINVAL) {
      fprintf(stderr, "vrna_alloc: requested size: %d\n", size);
      vrna_message_error("Memory allocation failure -> EINVAL");
    }

    if (errno == ENOMEM)
#endif
    vrna_message_error("Memory allocation failure -> no memory");
  }

  return pointer;
}